

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

uint __thiscall
ON_MeshComponentRef::GetMeshTopologyVertexAndPoint
          (ON_MeshComponentRef *this,ON_MeshTopologyVertex **topv,ON_3dPoint *point)

{
  ON_MeshTopologyVertex *pOVar1;
  TYPE TVar2;
  uint uVar3;
  int iVar4;
  ON_MeshTopologyVertex *pOVar5;
  uint *puVar6;
  bool bVar7;
  double dVar8;
  ON_MeshTopology *pOVar9;
  ON_3dPointListRef *unaff_R12;
  ON_3dPointListRef vertex_list;
  ON_3dPointListRef local_40;
  
  if ((this->m_mesh == (ON_Mesh *)0x0) || ((this->m_mesh_ci).m_index < 0)) goto LAB_00516927;
  pOVar9 = MeshTopology(this);
  if (pOVar9 == (ON_MeshTopology *)0x0) {
    bVar7 = true;
  }
  else {
    unaff_R12 = &local_40;
    ON_3dPointListRef::ON_3dPointListRef(unaff_R12,this->m_mesh);
    bVar7 = true;
    if ((pOVar9->m_topv_map).m_count == local_40.m_point_count) {
      TVar2 = (this->m_mesh_ci).m_type;
      if (TVar2 == meshtop_vertex) {
        uVar3 = (this->m_mesh_ci).m_index;
        if (uVar3 < (uint)(pOVar9->m_topv).m_count) {
          pOVar5 = (pOVar9->m_topv).m_a;
          pOVar1 = pOVar5 + (int)uVar3;
          *topv = pOVar1;
          if (((pOVar5[(int)uVar3].m_v_count < 1) ||
              (puVar6 = (uint *)pOVar1->m_vi, puVar6 == (uint *)0x0)) ||
             (uVar3 = *puVar6, local_40.m_point_count <= uVar3 || (int)uVar3 < 0)) {
            point->z = ON_3dPoint::UnsetPoint.z;
            dVar8 = ON_3dPoint::UnsetPoint.y;
            point->x = ON_3dPoint::UnsetPoint.x;
            point->y = dVar8;
          }
          else {
            ON_3dPointListRef::GetPoint(&local_40,uVar3,&point->x);
          }
          unaff_R12 = (ON_3dPointListRef *)(ulong)(uint)(this->m_mesh_ci).m_index;
LAB_005169bb:
          bVar7 = false;
        }
      }
      else if (TVar2 == mesh_vertex) {
        uVar3 = (this->m_mesh_ci).m_index;
        if (uVar3 < local_40.m_point_count) {
          iVar4 = (pOVar9->m_topv_map).m_a[(int)uVar3];
          unaff_R12 = (ON_3dPointListRef *)(long)iVar4;
          if ((-1 < (long)unaff_R12) && (iVar4 < (pOVar9->m_topv).m_count)) {
            *topv = (pOVar9->m_topv).m_a + (long)unaff_R12;
            ON_3dPointListRef::GetPoint(&local_40,uVar3,&point->x);
            goto LAB_005169bb;
          }
        }
      }
    }
  }
  if (!bVar7) {
    return (uint)unaff_R12;
  }
LAB_00516927:
  *topv = (ON_MeshTopologyVertex *)0x0;
  point->z = ON_3dPoint::UnsetPoint.z;
  dVar8 = ON_3dPoint::UnsetPoint.y;
  point->x = ON_3dPoint::UnsetPoint.x;
  point->y = dVar8;
  return 0xffffffff;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshTopologyVertexAndPoint(
  const struct ON_MeshTopologyVertex*& topv,
  class ON_3dPoint& point
  ) const
{
  if ( m_mesh && m_mesh_ci.m_index >= 0 )
  {
    const ON_MeshTopology* top = MeshTopology();
    if ( 0 != top )
    {
      const ON_3dPointListRef vertex_list(m_mesh);
      if ( top->m_topv_map.UnsignedCount() == vertex_list.PointCount() )
      {
        switch(m_mesh_ci.m_type)
        {
        case ON_COMPONENT_INDEX::mesh_vertex:
          if ( (unsigned int)m_mesh_ci.m_index < vertex_list.PointCount() )
          {
            int tvi = top->m_topv_map[m_mesh_ci.m_index];
            if ( tvi >= 0 && tvi < top->m_topv.Count() )
            {
              topv = &top->m_topv[tvi];
              vertex_list.GetPoint(m_mesh_ci.m_index,&point.x);
              return (unsigned int)tvi;
            }
          }
          break;

        case ON_COMPONENT_INDEX::meshtop_vertex:
          if ( (unsigned int)m_mesh_ci.m_index < top->m_topv.UnsignedCount() )
          {
            const ON_MeshTopologyVertex& v = top->m_topv[m_mesh_ci.m_index];
            topv = &v;
            if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 && (unsigned int)v.m_vi[0] < vertex_list.PointCount() )
              vertex_list.GetPoint(v.m_vi[0],&point.x);
            else
              point = ON_3dPoint::UnsetPoint;
            return (unsigned int)m_mesh_ci.m_index;
          }
          break;
        
        default:
          break;
        }
      }
    }
  }

  topv = 0;
  point = ON_3dPoint::UnsetPoint;
  return ON_UNSET_UINT_INDEX;
}